

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  bool bVar1;
  stbi_uc sVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  int b;
  int iVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar9;
  float *output;
  stbi_uc *psVar10;
  byte *pbVar11;
  stbi_uc *psVar12;
  int d;
  long lVar13;
  int iVar14;
  float *output_00;
  long lVar15;
  int *piVar16;
  ulong uVar17;
  int c;
  uint uVar18;
  long in_FS_OFFSET;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  char cStack_4b8;
  char cStack_4b7;
  char cStack_4b6;
  char cStack_4b5;
  char cStack_4b4;
  char cStack_4b3;
  char cStack_4b2;
  char cStack_4b1;
  char buffer [1024];
  stbi_uc rgbe [4];
  long local_80;
  ulong local_78;
  stbi_uc local_6c [4];
  stbi_uc *psStack_68;
  stbi_uc rgbe_1 [4];
  float *local_60;
  char *local_58;
  int *local_50;
  stbi_uc *local_48;
  int *local_40;
  int local_34;
  ulong uVar8;
  
  iVar14 = req_comp;
  local_40 = y;
  stbi__hdr_gettoken(s,&cStack_4b8);
  if ((CONCAT17(buffer[2],
                CONCAT16(buffer[1],
                         CONCAT15(buffer[0],
                                  CONCAT14(cStack_4b1,
                                           CONCAT13(cStack_4b2,
                                                    CONCAT12(cStack_4b3,
                                                             CONCAT11(cStack_4b4,cStack_4b5)))))))
       == 0x45434e41494441 &&
       CONCAT17(cStack_4b1,
                CONCAT16(cStack_4b2,
                         CONCAT15(cStack_4b3,
                                  CONCAT14(cStack_4b4,
                                           CONCAT13(cStack_4b5,
                                                    CONCAT12(cStack_4b6,
                                                             CONCAT11(cStack_4b7,cStack_4b8)))))))
       == 0x4e41494441523f23) ||
     (CONCAT13(cStack_4b2,CONCAT12(cStack_4b3,CONCAT11(cStack_4b4,cStack_4b5))) == 0x454247 &&
      CONCAT13(cStack_4b5,CONCAT12(cStack_4b6,CONCAT11(cStack_4b7,cStack_4b8))) == 0x47523f23)) {
    stbi__hdr_gettoken(s,&cStack_4b8);
    if (cStack_4b8 != '\0') {
      bVar1 = false;
      local_50 = comp;
      local_34 = req_comp;
      do {
        auVar19[0] = -(cStack_4b1 == '3');
        auVar19[1] = -(buffer[0] == '2');
        auVar19[2] = -(buffer[1] == '-');
        auVar19[3] = -(buffer[2] == 'b');
        auVar19[4] = -(buffer[3] == 'i');
        auVar19[5] = -(buffer[4] == 't');
        auVar19[6] = -(buffer[5] == '_');
        auVar19[7] = -(buffer[6] == 'r');
        auVar19[8] = -(buffer[7] == 'l');
        auVar19[9] = -(buffer[8] == 'e');
        auVar19[10] = -(buffer[9] == '_');
        auVar19[0xb] = -(buffer[10] == 'r');
        auVar19[0xc] = -(buffer[0xb] == 'g');
        auVar19[0xd] = -(buffer[0xc] == 'b');
        auVar19[0xe] = -(buffer[0xd] == 'e');
        auVar19[0xf] = -(buffer[0xe] == '\0');
        auVar20[0] = -(cStack_4b8 == 'F');
        auVar20[1] = -(cStack_4b7 == 'O');
        auVar20[2] = -(cStack_4b6 == 'R');
        auVar20[3] = -(cStack_4b5 == 'M');
        auVar20[4] = -(cStack_4b4 == 'A');
        auVar20[5] = -(cStack_4b3 == 'T');
        auVar20[6] = -(cStack_4b2 == '=');
        auVar20[7] = -(cStack_4b1 == '3');
        auVar20[8] = -(buffer[0] == '2');
        auVar20[9] = -(buffer[1] == '-');
        auVar20[10] = -(buffer[2] == 'b');
        auVar20[0xb] = -(buffer[3] == 'i');
        auVar20[0xc] = -(buffer[4] == 't');
        auVar20[0xd] = -(buffer[5] == '_');
        auVar20[0xe] = -(buffer[6] == 'r');
        auVar20[0xf] = -(buffer[7] == 'l');
        auVar20 = auVar20 & auVar19;
        if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff) {
          bVar1 = true;
        }
        stbi__hdr_gettoken(s,&cStack_4b8);
      } while (cStack_4b8 != '\0');
      if (bVar1) {
        local_58 = &cStack_4b8;
        stbi__hdr_gettoken(s,&cStack_4b8);
        if (cStack_4b6 == ' ' && CONCAT11(cStack_4b7,cStack_4b8) == 0x592d) {
          local_58 = &cStack_4b5;
          uVar8 = strtol(local_58,&local_58,10);
          b = (int)uVar8;
          local_58 = local_58 + -1;
          do {
            pcVar7 = local_58;
            local_58 = pcVar7 + 1;
          } while (pcVar7[1] == ' ');
          iVar5 = strncmp(local_58,"+X ",3);
          if (iVar5 == 0) {
            local_58 = pcVar7 + 4;
            uVar9 = strtol(local_58,(char **)0x0,10);
            if ((b < 0x1000001) && (iVar5 = (int)uVar9, iVar5 < 0x1000001)) {
              *x = iVar5;
              *local_40 = b;
              if (local_50 != (int *)0x0) {
                *local_50 = 3;
              }
              c = 3;
              if (local_34 != 0) {
                c = local_34;
              }
              d = b;
              iVar6 = stbi__mad4sizes_valid(iVar5,b,c,b,iVar14);
              if (iVar6 != 0) {
                output = (float *)stbi__malloc_mad4(iVar5,b,c,d,iVar14);
                if (output != (float *)0x0) {
                  local_50 = (int *)CONCAT44(local_50._4_4_,c);
                  iVar14 = 0;
                  local_40 = (int *)uVar9;
                  if (iVar5 - 0x8000U < 0xffff8008) goto LAB_001146ea;
                  if (b < 1) {
                    psVar10 = (stbi_uc *)0x0;
                  }
                  else {
                    local_78 = 0;
                    local_48 = (stbi_uc *)0x0;
                    local_60 = output;
                    do {
                      piVar16 = local_40;
                      sVar2 = stbi__get8(s);
                      sVar3 = stbi__get8(s);
                      sVar4 = stbi__get8(s);
                      if (((sVar2 != '\x02') || (sVar3 != '\x02')) || ((char)sVar4 < '\0')) {
                        buffer[0x3fc] = sVar2;
                        buffer[0x3fd] = sVar3;
                        buffer[0x3fe] = sVar4;
                        buffer[0x3ff] = stbi__get8(s);
                        stbi__hdr_convert(output,(stbi_uc *)(buffer + 0x3fc),(int)local_50);
                        free(local_48);
                        iVar14 = 0;
                        iVar5 = 1;
                        do {
                          stbi__getn(s,local_6c,4);
                          piVar16 = local_40;
                          stbi__hdr_convert(output + (long)((int)local_50 * (int)local_40 * iVar14)
                                                     + (long)(iVar5 * (int)local_50),local_6c,
                                            (int)local_50);
                          iVar5 = iVar5 + 1;
                          while ((int)piVar16 <= iVar5) {
                            iVar14 = iVar14 + 1;
LAB_001146ea:
                            iVar5 = 0;
                            piVar16 = local_40;
                            if (b <= iVar14) {
                              return output;
                            }
                          }
                        } while( true );
                      }
                      sVar2 = stbi__get8(s);
                      if ((uint)CONCAT11(sVar4,sVar2) != (uint)piVar16) {
                        free(output);
                        free(local_48);
                        pcVar7 = "invalid decoded scanline length";
                        goto LAB_00114298;
                      }
                      psVar10 = local_48;
                      if ((local_48 == (stbi_uc *)0x0) &&
                         (psVar10 = (stbi_uc *)malloc((ulong)(uint)(iVar5 * 4)),
                         psVar10 == (stbi_uc *)0x0)) {
                        free(output);
                        goto LAB_001146db;
                      }
                      local_80 = 0;
                      psStack_68 = psVar10;
                      local_48 = psVar10;
                      do {
                        if (0 < (int)piVar16) {
                          uVar17 = (ulong)piVar16 & 0xffffffff;
                          iVar14 = 0;
                          do {
                            local_34 = iVar14;
                            pbVar11 = s->img_buffer;
                            if (pbVar11 < s->img_buffer_end) {
LAB_0011449b:
                              s->img_buffer = pbVar11 + 1;
                              uVar18 = (uint)*pbVar11;
                            }
                            else {
                              if (s->read_from_callbacks != 0) {
                                stbi__refill_buffer(s);
                                pbVar11 = s->img_buffer;
                                goto LAB_0011449b;
                              }
                              uVar18 = 0;
                            }
                            psVar10 = psStack_68;
                            if ((byte)uVar18 < 0x81) {
                              if ((uint)uVar17 < uVar18) goto LAB_00114643;
                              iVar14 = local_34;
                              if (uVar18 != 0) {
                                lVar13 = (long)local_34;
                                lVar15 = 0;
                                do {
                                  psVar12 = s->img_buffer;
                                  if (psVar12 < s->img_buffer_end) {
LAB_0011456b:
                                    s->img_buffer = psVar12 + 1;
                                    sVar2 = *psVar12;
                                  }
                                  else {
                                    if (s->read_from_callbacks != 0) {
                                      stbi__refill_buffer(s);
                                      psVar12 = s->img_buffer;
                                      goto LAB_0011456b;
                                    }
                                    sVar2 = '\0';
                                  }
                                  psVar10[lVar15 * 4 + lVar13 * 4] = sVar2;
                                  lVar15 = lVar15 + 1;
                                } while (uVar18 != (uint)lVar15);
                                iVar14 = local_34 + (uint)lVar15;
                              }
                            }
                            else {
                              psVar10 = s->img_buffer;
                              if (psVar10 < s->img_buffer_end) {
LAB_001144dc:
                                s->img_buffer = psVar10 + 1;
                                sVar2 = *psVar10;
                              }
                              else {
                                if (s->read_from_callbacks != 0) {
                                  stbi__refill_buffer(s);
                                  psVar10 = s->img_buffer;
                                  goto LAB_001144dc;
                                }
                                sVar2 = '\0';
                              }
                              if ((uint)uVar17 < (uVar18 & 0x7f)) {
LAB_00114643:
                                free(output);
                                free(local_48);
                                pcVar7 = "corrupt";
                                goto LAB_00114298;
                              }
                              iVar14 = local_34;
                              if ((uVar18 & 0x7f) != 0) {
                                lVar13 = 0;
                                do {
                                  psStack_68[lVar13 * 4 + (long)local_34 * 4] = sVar2;
                                  lVar13 = lVar13 + 1;
                                } while ((uVar18 & 0x7f) != (uint)lVar13);
                                iVar14 = local_34 + (uint)lVar13;
                              }
                            }
                            uVar18 = (int)local_40 - iVar14;
                            uVar17 = (ulong)uVar18;
                            piVar16 = local_40;
                          } while (uVar18 != 0 && iVar14 <= (int)local_40);
                        }
                        local_80 = local_80 + 1;
                        psStack_68 = psStack_68 + 1;
                      } while (local_80 != 4);
                      output_00 = local_60;
                      uVar17 = uVar9 & 0x7fffffff;
                      psVar10 = local_48;
                      if (0 < (int)piVar16) {
                        do {
                          stbi__hdr_convert(output_00,psVar10,(int)local_50);
                          output_00 = output_00 + c;
                          psVar10 = psVar10 + 4;
                          uVar17 = uVar17 - 1;
                        } while (uVar17 != 0);
                      }
                      local_78 = local_78 + 1;
                      local_60 = local_60 + (uVar9 & 0xffffffff) * (long)c;
                      psVar10 = local_48;
                    } while (local_78 != (uVar8 & 0x7fffffff));
                  }
                  if (psVar10 == (stbi_uc *)0x0) {
                    return output;
                  }
                  free(psVar10);
                  return output;
                }
LAB_001146db:
                pcVar7 = "outofmem";
                goto LAB_00114298;
              }
            }
            pcVar7 = "too large";
            goto LAB_00114298;
          }
        }
        pcVar7 = "unsupported data layout";
        goto LAB_00114298;
      }
    }
    pcVar7 = "unsupported format";
  }
  else {
    pcVar7 = "not HDR";
  }
LAB_00114298:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar7;
  return (float *)0x0;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;
   const char *headerToken;
   STBI_NOTUSED(ri);

   // Check identifier
   headerToken = stbi__hdr_gettoken(s,buffer);
   if (strcmp(headerToken, "#?RADIANCE") != 0 && strcmp(headerToken, "#?RGBE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   if (height > STBI_MAX_DIMENSIONS) return stbi__errpf("too large","Very large image (corrupt?)");
   if (width > STBI_MAX_DIMENSIONS) return stbi__errpf("too large","Very large image (corrupt?)");

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   if (!stbi__mad4sizes_valid(width, height, req_comp, sizeof(float), 0))
      return stbi__errpf("too large", "HDR image is too large");

   // Read data
   hdr_data = (float *) stbi__malloc_mad4(width, height, req_comp, sizeof(float), 0);
   if (!hdr_data)
      return stbi__errpf("outofmem", "Out of memory");

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) {
            scanline = (stbi_uc *) stbi__malloc_mad2(width, 4, 0);
            if (!scanline) {
               STBI_FREE(hdr_data);
               return stbi__errpf("outofmem", "Out of memory");
            }
         }

         for (k = 0; k < 4; ++k) {
            int nleft;
            i = 0;
            while ((nleft = width - i) > 0) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      if (scanline)
         STBI_FREE(scanline);
   }

   return hdr_data;
}